

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_connecter_base.cpp
# Opt level: O0

void __thiscall
zmq::stream_connecter_base_t::stream_connecter_base_t
          (stream_connecter_base_t *this,io_thread_t *io_thread_,session_base_t *session_,
          options_t *options_,address_t *addr_,bool delayed_start_)

{
  socket_base_t *psVar1;
  session_base_t *in_RDX;
  io_thread_t *in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  string *in_stack_00000160;
  address_t *in_stack_00000168;
  io_thread_t *in_stack_ffffffffffffffa8;
  command_t **ppcVar2;
  options_t *in_stack_ffffffffffffffb0;
  own_t *in_stack_ffffffffffffffc0;
  
  own_t::own_t(in_stack_ffffffffffffffc0,in_RDI,in_stack_ffffffffffffffb0);
  io_object_t::io_object_t((io_object_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (in_RDI->super_object_t)._vptr_object_t = (_func_int **)&PTR__stream_connecter_base_t_003eab48;
  in_RDI[6]._mailbox._cpipe.super_ypipe_base_t<zmq::command_t>._vptr_ypipe_base_t =
       (_func_int **)&DAT_003eac38;
  *(undefined8 *)&in_RDI[6]._mailbox._cpipe._queue._begin_pos = in_R8;
  *(undefined4 *)&in_RDI[6]._mailbox._cpipe._queue._back_chunk = 0xffffffff;
  *(undefined8 *)&in_RDI[6]._mailbox._cpipe._queue._back_pos = 0;
  std::__cxx11::string::string((string *)&in_RDI[6]._mailbox._cpipe._queue._end_chunk);
  ppcVar2 = &in_RDI[6]._mailbox._cpipe._r;
  psVar1 = session_base_t::get_socket(in_RDX);
  *ppcVar2 = (command_t *)psVar1;
  *(byte *)&in_RDI[6]._mailbox._cpipe._f = in_R9B & 1;
  *(undefined1 *)((long)&in_RDI[6]._mailbox._cpipe._f + 1) = 0;
  *(undefined4 *)((long)&in_RDI[6]._mailbox._cpipe._f + 4) =
       *(undefined4 *)&in_RDI[1]._mailbox._cpipe._c._ptr._M_b._M_p;
  in_RDI[6]._mailbox._cpipe._c._ptr._M_b._M_p = (__pointer_type)in_RDX;
  if (*(long *)&in_RDI[6]._mailbox._cpipe._queue._begin_pos == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_connecter_base.cpp"
            ,0x3f);
    fflush(_stderr);
    zmq_abort((char *)0x313130);
  }
  address_t::to_string(in_stack_00000168,in_stack_00000160);
  return;
}

Assistant:

zmq::stream_connecter_base_t::stream_connecter_base_t (
  zmq::io_thread_t *io_thread_,
  zmq::session_base_t *session_,
  const zmq::options_t &options_,
  zmq::address_t *addr_,
  bool delayed_start_) :
    own_t (io_thread_, options_),
    io_object_t (io_thread_),
    _addr (addr_),
    _s (retired_fd),
    _handle (static_cast<handle_t> (NULL)),
    _socket (session_->get_socket ()),
    _delayed_start (delayed_start_),
    _reconnect_timer_started (false),
    _current_reconnect_ivl (options.reconnect_ivl),
    _session (session_)
{
    zmq_assert (_addr);
    _addr->to_string (_endpoint);
    // TODO the return value is unused! what if it fails? if this is impossible
    // or does not matter, change such that endpoint in initialized using an
    // initializer, and make endpoint const
}